

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NetTypeDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetTypeDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::parsing::Token&,slang::syntax::WithFunctionClauseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,Token *args_3,WithFunctionClauseSyntax **args_4,
          Token *args_5)

{
  Token keyword;
  Token name;
  Token semi;
  NetTypeDeclarationSyntax *this_00;
  
  this_00 = (NetTypeDeclarationSyntax *)allocate(this,0x80,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  name.kind = args_3->kind;
  name._2_1_ = args_3->field_0x2;
  name.numFlags.raw = (args_3->numFlags).raw;
  name.rawLen = args_3->rawLen;
  name.info = args_3->info;
  slang::syntax::NetTypeDeclarationSyntax::NetTypeDeclarationSyntax
            (this_00,args,keyword,args_2,name,*args_4,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }